

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_default_vfs_tell__stdio(ma_vfs *pVFS,ma_vfs_file file,ma_int64 *pCursor)

{
  long lVar1;
  long *in_RDX;
  FILE *in_RSI;
  ma_int64 result;
  
  lVar1 = ftell(in_RSI);
  *in_RDX = lVar1;
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_default_vfs_tell__stdio(ma_vfs* pVFS, ma_vfs_file file, ma_int64* pCursor)
{
    ma_int64 result;

    MA_ASSERT(file    != NULL);
    MA_ASSERT(pCursor != NULL);

    (void)pVFS;

#if defined(_WIN32)
    #if defined(_MSC_VER) && _MSC_VER > 1200
        result = _ftelli64((FILE*)file);
    #else
        result = ftell((FILE*)file);
    #endif
#else
    result = ftell((FILE*)file);
#endif

    *pCursor = result;

    return MA_SUCCESS;
}